

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

PortHeaderSyntax * __thiscall
slang::parsing::Parser::parsePortHeader(Parser *this,Token constKeyword,Token direction)

{
  Token netType_00;
  Token nameOrKeyword;
  Token direction_00;
  Token nameOrKeyword_00;
  Token placeholder;
  Token direction_01;
  Token direction_02;
  Token direction_03;
  Token constKeyword_00;
  Token signing;
  Token constKeyword_01;
  Token constKeyword_02;
  SourceRange range;
  Token varKeyword_00;
  Token varKeyword_01;
  Token varKeyword_02;
  bool bVar1;
  bool bVar2;
  NetPortHeaderSyntax *pNVar3;
  InterfacePortHeaderSyntax *pIVar4;
  long lVar5;
  Info *pIVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Info *in_R8;
  Token TVar7;
  Parser *in_stack_000000f0;
  bitmask<slang::parsing::detail::TypeOptions> in_stack_000000fc;
  DataTypeSyntax *type;
  InterfacePortHeaderSyntax *header;
  Token name;
  Token varKeyword;
  Token keyword;
  DataTypeSyntax *dataType;
  Token netType;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffd78;
  Token *in_stack_fffffffffffffd80;
  ParserBase *in_stack_fffffffffffffd88;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_fffffffffffffd90;
  ParserBase *in_stack_fffffffffffffd98;
  ParserBase *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  undefined4 in_stack_fffffffffffffdb0;
  DiagCode in_stack_fffffffffffffdb4;
  Parser *in_stack_fffffffffffffdb8;
  bitmask<slang::parsing::detail::TypeOptions> local_234;
  ParserBase *in_stack_fffffffffffffdd0;
  SyntaxFactory *local_228;
  ParserBase *in_stack_fffffffffffffde0;
  SourceLocation in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  DiagCode code;
  DataTypeSyntax *local_200;
  SyntaxFactory *local_1f8;
  bitmask<slang::parsing::detail::TypeOptions> local_174;
  ImplicitTypeSyntax *local_170;
  undefined8 local_168;
  Info *local_160;
  VariablePortHeaderSyntax *local_158;
  Token local_150;
  Token local_140;
  Token local_130;
  Token local_120;
  bitmask<slang::parsing::detail::TypeOptions> local_10c;
  DataTypeSyntax *local_108;
  Info *local_100;
  Token local_f8;
  undefined8 local_e8;
  undefined8 local_e0;
  Token local_d8;
  undefined8 local_c8;
  Info *local_c0;
  Token local_b8;
  SourceLocation local_a8;
  undefined4 local_9c;
  undefined8 local_98;
  Info *local_90;
  Token local_88;
  SourceRange local_78;
  undefined4 local_68;
  bitmask<slang::parsing::detail::TypeOptions> local_64;
  SyntaxNode *local_60;
  Token local_58;
  Token local_48;
  TokenKind local_32;
  Token local_28;
  undefined8 local_18;
  undefined8 local_10;
  VariablePortHeaderSyntax *local_8;
  
  code = SUB84((ulong)in_stack_fffffffffffffdf0 >> 0x20,0);
  local_28._0_8_ = in_RCX;
  local_28.info = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDX;
  local_48 = ParserBase::peek(in_stack_fffffffffffffd78);
  local_32 = local_48.kind;
  bVar1 = Token::operator_cast_to_bool((Token *)0xbd8a8e);
  if (!bVar1) {
    bVar1 = slang::syntax::SyntaxFacts::isNetType(local_32);
    if (bVar1) {
      local_58 = ParserBase::consume(in_stack_fffffffffffffda0);
      bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_64,AllowImplicit);
      local_60 = (SyntaxNode *)parseDataType(in_stack_000000f0,in_stack_000000fc);
      if (local_58.kind == InterconnectKeyword) {
        if (local_60->kind == ImplicitType) {
          slang::syntax::SyntaxNode::as<slang::syntax::ImplicitTypeSyntax>(local_60);
          bVar1 = Token::operator_cast_to_bool((Token *)0xbd8b26);
          if (!bVar1) goto LAB_00bd8b77;
        }
        local_68 = 0x660005;
        local_78 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffdd0);
        range.endLoc._0_7_ = in_stack_fffffffffffffda8;
        range.startLoc = (SourceLocation)in_stack_fffffffffffffda0;
        range.endLoc._7_1_ = in_stack_fffffffffffffdaf;
        ParserBase::addDiag(in_stack_fffffffffffffd98,in_stack_fffffffffffffdb4,range);
      }
LAB_00bd8b77:
      TVar7 = local_58;
      local_88.kind = local_28.kind;
      local_88._2_1_ = local_28._2_1_;
      local_88.numFlags.raw = local_28.numFlags.raw;
      local_88.rawLen = local_28.rawLen;
      local_88.info = local_28.info;
      local_98._0_2_ = local_58.kind;
      local_98._2_1_ = local_58._2_1_;
      local_98._3_1_ = local_58.numFlags.raw;
      local_98._4_4_ = local_58.rawLen;
      local_58.info = TVar7.info;
      local_90 = local_58.info;
      direction_03.info = (Info *)in_stack_fffffffffffffda0;
      direction_03._0_8_ = in_stack_fffffffffffffd98;
      netType_00.info = (Info *)in_stack_fffffffffffffd90;
      netType_00._0_8_ = in_stack_fffffffffffffd88;
      local_58 = TVar7;
      pNVar3 = slang::syntax::SyntaxFactory::netPortHeader
                         ((SyntaxFactory *)in_stack_fffffffffffffd80,direction_03,netType_00,
                          (DataTypeSyntax *)in_stack_fffffffffffffd78);
      return &pNVar3->super_PortHeaderSyntax;
    }
    if (local_32 == InterfaceKeyword) {
      bVar1 = Token::operator_cast_to_bool((Token *)0xbd8c1a);
      if (bVar1) {
        local_9c = 0x210005;
        local_a8 = Token::location(&local_28);
        ParserBase::addDiag(in_stack_fffffffffffffde0,code,in_stack_fffffffffffffde8);
      }
      TVar7 = ParserBase::consume(in_stack_fffffffffffffda0);
      local_b8._0_8_ = TVar7._0_8_;
      local_c8._0_2_ = local_b8.kind;
      local_c8._2_1_ = local_b8._2_1_;
      local_c8._3_1_ = local_b8.numFlags.raw;
      local_c8._4_4_ = local_b8.rawLen;
      local_b8.info = TVar7.info;
      local_c0 = local_b8.info;
      local_b8 = TVar7;
      parseDotMemberClause((Parser *)(in_RDI + 0xe0));
      nameOrKeyword.info = (Info *)in_stack_fffffffffffffd90;
      nameOrKeyword._0_8_ = in_stack_fffffffffffffd88;
      pIVar4 = slang::syntax::SyntaxFactory::interfacePortHeader
                         ((SyntaxFactory *)in_stack_fffffffffffffd80,nameOrKeyword,
                          (DotMemberClauseSyntax *)in_stack_fffffffffffffd78);
      return &pIVar4->super_PortHeaderSyntax;
    }
  }
  if (local_32 == VarKeyword) {
    local_d8 = ParserBase::consume(in_stack_fffffffffffffda0);
    lVar5 = in_RDI + 0xe0;
    local_e8 = local_18;
    local_e0 = local_10;
    local_f8.kind = local_28.kind;
    local_f8._2_1_ = local_28._2_1_;
    local_f8.numFlags.raw = local_28.numFlags.raw;
    local_f8.rawLen = local_28.rawLen;
    local_f8.info = local_28.info;
    local_108 = (DataTypeSyntax *)local_d8._0_8_;
    local_100 = local_d8.info;
    bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_10c,AllowImplicit);
    parseDataType(in_stack_000000f0,in_stack_000000fc);
    constKeyword_00.info = (Info *)in_stack_fffffffffffffda0;
    constKeyword_00._0_8_ = in_stack_fffffffffffffd98;
    direction_00.info = (Info *)in_stack_fffffffffffffd90;
    direction_00._0_8_ = in_stack_fffffffffffffd88;
    varKeyword_00.info = (Info *)in_stack_fffffffffffffdb8;
    varKeyword_00.kind = (short)lVar5;
    varKeyword_00._2_1_ = (char)((ulong)lVar5 >> 0x10);
    varKeyword_00.numFlags.raw = (char)((ulong)lVar5 >> 0x18);
    varKeyword_00.rawLen = (int)((ulong)lVar5 >> 0x20);
    local_8 = slang::syntax::SyntaxFactory::variablePortHeader
                        ((SyntaxFactory *)local_100,constKeyword_00,direction_00,varKeyword_00,
                         local_108);
  }
  else if (local_32 == Identifier) {
    bVar2 = Token::operator_cast_to_bool((Token *)0xbd8e07);
    bVar1 = false;
    if (!bVar2) {
      local_120 = ParserBase::peek(in_stack_fffffffffffffd88,
                                   (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      bVar1 = false;
      if (local_120.kind == Dot) {
        local_130 = ParserBase::peek(in_stack_fffffffffffffd88,
                                     (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        bVar1 = false;
        if (local_130.kind == Identifier) {
          local_140 = ParserBase::peek(in_stack_fffffffffffffd88,
                                       (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20));
          bVar1 = local_140.kind == Identifier;
        }
      }
    }
    if (bVar1) {
      TVar7 = ParserBase::consume(in_stack_fffffffffffffda0);
      local_150._0_8_ = TVar7._0_8_;
      local_168._0_2_ = local_150.kind;
      local_168._2_1_ = local_150._2_1_;
      local_168._3_1_ = local_150.numFlags.raw;
      local_168._4_4_ = local_150.rawLen;
      local_150.info = TVar7.info;
      local_160 = local_150.info;
      local_150 = TVar7;
      parseDotMemberClause(in_stack_fffffffffffffdb8);
      nameOrKeyword_00.info = (Info *)in_stack_fffffffffffffd90;
      nameOrKeyword_00._0_8_ = in_stack_fffffffffffffd88;
      local_158 = (VariablePortHeaderSyntax *)
                  slang::syntax::SyntaxFactory::interfacePortHeader
                            ((SyntaxFactory *)in_stack_fffffffffffffd80,nameOrKeyword_00,
                             (DotMemberClauseSyntax *)in_stack_fffffffffffffd78);
      std::
      vector<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
      ::push_back((vector<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
                   *)in_stack_fffffffffffffd90,(value_type *)in_stack_fffffffffffffd88);
      local_8 = local_158;
    }
    else {
      bVar1 = isPlainPortName(in_stack_fffffffffffffdb8);
      if (bVar1) {
        in_stack_fffffffffffffd98 = (ParserBase *)(in_RDI + 0xe0);
        Token::Token(in_stack_fffffffffffffd80);
        slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        ParserBase::placeholderToken(in_stack_fffffffffffffdd0);
        signing.info = (Info *)in_stack_fffffffffffffda0;
        signing._0_8_ = in_stack_fffffffffffffd98;
        placeholder.info = (Info *)in_stack_fffffffffffffd90;
        placeholder._0_8_ = in_stack_fffffffffffffd88;
        local_170 = slang::syntax::SyntaxFactory::implicitType
                              ((SyntaxFactory *)in_stack_fffffffffffffd80,signing,
                               (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                               in_stack_fffffffffffffd78,placeholder);
      }
      else {
        memset(&local_174,0,4);
        bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_174);
        local_170 = (ImplicitTypeSyntax *)parseDataType(in_stack_000000f0,in_stack_000000fc);
      }
      pIVar6 = (Info *)(in_RDI + 0xe0);
      Token::Token(in_stack_fffffffffffffd80);
      constKeyword_01.info = (Info *)in_stack_fffffffffffffda0;
      constKeyword_01._0_8_ = in_stack_fffffffffffffd98;
      direction_01.info = pIVar6;
      direction_01._0_8_ = in_stack_fffffffffffffd88;
      varKeyword_01.rawLen._0_2_ = in_stack_fffffffffffffdb4.subsystem;
      varKeyword_01.rawLen._2_2_ = in_stack_fffffffffffffdb4.code;
      varKeyword_01.kind = (short)in_stack_fffffffffffffdb0;
      varKeyword_01._2_1_ = (char)((uint)in_stack_fffffffffffffdb0 >> 0x10);
      varKeyword_01.numFlags.raw = (char)((uint)in_stack_fffffffffffffdb0 >> 0x18);
      varKeyword_01.info = (Info *)in_stack_fffffffffffffdb8;
      local_8 = slang::syntax::SyntaxFactory::variablePortHeader
                          (local_1f8,constKeyword_01,direction_01,varKeyword_01,local_200);
    }
  }
  else {
    lVar5 = in_RDI + 0xe0;
    Token::Token(in_stack_fffffffffffffd80);
    bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_234,AllowImplicit);
    parseDataType(in_stack_000000f0,in_stack_000000fc);
    constKeyword_02.info = (Info *)in_stack_fffffffffffffda0;
    constKeyword_02._0_8_ = in_stack_fffffffffffffd98;
    direction_02.info = (Info *)in_stack_fffffffffffffd90;
    direction_02.kind = (short)lVar5;
    direction_02._2_1_ = (char)((ulong)lVar5 >> 0x10);
    direction_02.numFlags.raw = (char)((ulong)lVar5 >> 0x18);
    direction_02.rawLen = (int)((ulong)lVar5 >> 0x20);
    varKeyword_02.rawLen._0_2_ = in_stack_fffffffffffffdb4.subsystem;
    varKeyword_02.rawLen._2_2_ = in_stack_fffffffffffffdb4.code;
    varKeyword_02.kind = (short)in_stack_fffffffffffffdb0;
    varKeyword_02._2_1_ = (char)((uint)in_stack_fffffffffffffdb0 >> 0x10);
    varKeyword_02.numFlags.raw = (char)((uint)in_stack_fffffffffffffdb0 >> 0x18);
    varKeyword_02.info = (Info *)in_stack_fffffffffffffdb8;
    local_8 = slang::syntax::SyntaxFactory::variablePortHeader
                        (local_228,constKeyword_02,direction_02,varKeyword_02,
                         (DataTypeSyntax *)in_stack_fffffffffffffdd0);
  }
  return &local_8->super_PortHeaderSyntax;
}

Assistant:

PortHeaderSyntax& Parser::parsePortHeader(Token constKeyword, Token direction) {
    auto kind = peek().kind;

    if (!constKeyword) {
        if (isNetType(kind)) {
            auto netType = consume();
            auto& dataType = parseDataType(TypeOptions::AllowImplicit);

            if (netType.kind == TokenKind::InterconnectKeyword &&
                (dataType.kind != SyntaxKind::ImplicitType ||
                 dataType.as<ImplicitTypeSyntax>().signing)) {
                addDiag(diag::InterconnectTypeSyntax, dataType.sourceRange());
            }

            return factory.netPortHeader(direction, netType, dataType);
        }

        if (kind == TokenKind::InterfaceKeyword) {
            if (direction)
                addDiag(diag::DirectionOnInterfacePort, direction.location());

            auto keyword = consume();
            return factory.interfacePortHeader(keyword, parseDotMemberClause());
        }
    }

    if (kind == TokenKind::VarKeyword) {
        auto varKeyword = consume();
        return factory.variablePortHeader(constKeyword, direction, varKeyword,
                                          parseDataType(TypeOptions::AllowImplicit));
    }

    if (kind == TokenKind::Identifier) {
        // could be a bunch of different things here; scan ahead to see
        if (!constKeyword && peek(1).kind == TokenKind::Dot &&
            peek(2).kind == TokenKind::Identifier && peek(3).kind == TokenKind::Identifier) {
            auto name = consume();
            InterfacePortHeaderSyntax* header =
                &factory.interfacePortHeader(name, parseDotMemberClause());
            meta.interfacePorts.push_back(header);
            return *header;
        }

        DataTypeSyntax* type;
        if (!isPlainPortName())
            type = &parseDataType();
        else
            type = &factory.implicitType(Token(), nullptr, placeholderToken());

        return factory.variablePortHeader(constKeyword, direction, Token(), *type);
    }

    // assume we have some kind of data type here
    return factory.variablePortHeader(constKeyword, direction, Token(),
                                      parseDataType(TypeOptions::AllowImplicit));
}